

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O3

void KeccakP1600_Initialize(void *state)

{
  *(undefined8 *)((long)state + 0xc0) = 0;
  *(undefined8 *)((long)state + 0x80) = 0;
  *(undefined8 *)((long)state + 0x88) = 0;
  *(undefined8 *)((long)state + 0x90) = 0;
  *(undefined8 *)((long)state + 0x98) = 0;
  *(undefined8 *)((long)state + 0xa0) = 0;
  *(undefined8 *)((long)state + 0xa8) = 0;
  *(undefined8 *)((long)state + 0xb0) = 0;
  *(undefined8 *)((long)state + 0xb8) = 0;
  *(undefined8 *)((long)state + 0x40) = 0;
  *(undefined8 *)((long)state + 0x48) = 0;
  *(undefined8 *)((long)state + 0x50) = 0;
  *(undefined8 *)((long)state + 0x58) = 0;
  *(undefined8 *)((long)state + 0x60) = 0;
  *(undefined8 *)((long)state + 0x68) = 0;
  *(undefined8 *)((long)state + 0x70) = 0;
  *(undefined8 *)((long)state + 0x78) = 0;
  *(undefined8 *)state = 0;
  *(undefined8 *)((long)state + 8) = 0;
  *(undefined8 *)((long)state + 0x10) = 0;
  *(undefined8 *)((long)state + 0x18) = 0;
  *(undefined8 *)((long)state + 0x20) = 0;
  *(undefined8 *)((long)state + 0x28) = 0;
  *(undefined8 *)((long)state + 0x30) = 0;
  *(undefined8 *)((long)state + 0x38) = 0;
  return;
}

Assistant:

void KeccakP1600_Initialize(void *state)
{
    memset(state, 0, 200);
#ifdef KeccakP1600_useLaneComplementing
    ((uint64_t*)state)[ 1] = ~(uint64_t)0;
    ((uint64_t*)state)[ 2] = ~(uint64_t)0;
    ((uint64_t*)state)[ 8] = ~(uint64_t)0;
    ((uint64_t*)state)[12] = ~(uint64_t)0;
    ((uint64_t*)state)[17] = ~(uint64_t)0;
    ((uint64_t*)state)[20] = ~(uint64_t)0;
#endif
}